

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O1

void save_roller_data(birther *tosave)

{
  player *ppVar1;
  long lVar2;
  
  tosave->race = player->race;
  ppVar1 = player;
  tosave->class = player->class;
  tosave->age = ppVar1->age;
  tosave->wt = ppVar1->wt_birth;
  tosave->ht = ppVar1->ht_birth;
  tosave->au = ppVar1->au_birth;
  lVar2 = 0;
  do {
    tosave->stat[lVar2] = ppVar1->stat_birth[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  if (tosave->history != (char *)0x0) {
    string_free(tosave->history);
  }
  ppVar1 = player;
  tosave->history = player->history;
  ppVar1->history = (char *)0x0;
  my_strcpy(tosave->name,ppVar1->full_name,0x20);
  return;
}

Assistant:

static void save_roller_data(birther *tosave)
{
	int i;

	/* Save the data */
	tosave->race = player->race;
	tosave->class = player->class;
	tosave->age = player->age;
	tosave->wt = player->wt_birth;
	tosave->ht = player->ht_birth;
	tosave->au = player->au_birth;

	/* Save the stats */
	for (i = 0; i < STAT_MAX; i++)
		tosave->stat[i] = player->stat_birth[i];

	if (tosave->history) {
		string_free(tosave->history);
	}
	tosave->history = player->history;
	player->history = NULL;
	my_strcpy(tosave->name, player->full_name, sizeof(tosave->name));
}